

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void highbd_hev_filter_mask_x_sse2
               (__m128i *pq,int x,__m128i *p1p0,__m128i *q1q0,__m128i *abs_p1p0,__m128i *l,
               __m128i *bl,__m128i *t,__m128i *hev,__m128i *mask)

{
  short sVar1;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  int in_ESI;
  undefined1 (*in_RDI) [16];
  ulong *in_R8;
  undefined1 (*in_R9) [16];
  ushort uVar16;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  __m128i ffff;
  __m128i one;
  __m128i zero;
  int local_54c;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_508;
  ulong local_4f8;
  ulong local_408;
  ulong uStack_400;
  short local_3d8;
  short sStack_3d6;
  short sStack_3d4;
  short sStack_3d2;
  short sStack_3d0;
  short sStack_3ce;
  short sStack_3cc;
  short sStack_3ca;
  short local_3b8;
  short sStack_3b6;
  short sStack_3b4;
  short sStack_3b2;
  short sStack_3b0;
  short sStack_3ae;
  short sStack_3ac;
  short sStack_3aa;
  short local_398;
  short sStack_396;
  short sStack_394;
  short sStack_392;
  short sStack_390;
  short sStack_38e;
  short sStack_38c;
  short sStack_38a;
  ushort local_378;
  ushort uStack_376;
  ushort uStack_374;
  ushort uStack_372;
  undefined4 uStack_360;
  undefined4 uStack_350;
  ulong local_328;
  ulong uStack_320;
  ulong local_318;
  ulong uStack_310;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short sStack_78;
  short sStack_76;
  int i;
  __m128i h;
  __m128i max01;
  __m128i max;
  __m128i abs_q1q0;
  __m128i abs_p1q1;
  __m128i abs_p0q0;
  __m128i abs_p0q0_p1q1;
  short sVar2;
  short sVar3;
  short sVar4;
  
  uVar7 = *(undefined8 *)in_RDI[1];
  *(undefined8 *)*in_RDX = *(undefined8 *)*in_RDI;
  *(undefined8 *)(*in_RDX + 8) = uVar7;
  uVar6 = *(undefined4 *)(*in_RDI + 0xc);
  uVar5 = *(undefined4 *)(in_RDI[1] + 0xc);
  *(undefined4 *)(*in_RCX + 8) = uStack_350;
  *(undefined4 *)(*in_RCX + 0xc) = uVar6;
  *(undefined4 *)in_RCX[1] = uStack_360;
  *(undefined4 *)(in_RCX[1] + 4) = uVar5;
  auVar21 = psubusw(*in_RDX,*in_RCX);
  auVar17 = psubusw(*in_RCX,*in_RDX);
  local_298 = auVar21._0_8_;
  uStack_290 = auVar21._8_8_;
  local_2a8 = auVar17._0_8_;
  uStack_2a0 = auVar17._8_8_;
  uStack_290 = uStack_290 | uStack_2a0;
  auVar13._8_8_ = uStack_290;
  auVar13._0_8_ = local_298 | local_2a8;
  auVar12._8_8_ = uStack_290;
  auVar12._0_8_ = local_298 | local_2a8;
  auVar17 = paddusw(auVar13,auVar12);
  local_4f8 = auVar17._0_8_;
  local_378 = (ushort)uStack_290;
  uStack_376 = (ushort)(uStack_290 >> 0x10);
  uStack_374 = (ushort)(uStack_290 >> 0x20);
  local_508 = CONCAT26((ushort)(uStack_290 >> 0x31),
                       CONCAT24(uStack_374 >> 1,CONCAT22(uStack_376 >> 1,local_378 >> 1)));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_4f8;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_508;
  auVar17 = paddusw(auVar11,auVar21);
  auVar17 = psubusw(auVar17,*(undefined1 (*) [16])ffff[1]);
  local_398 = auVar17._0_2_;
  sStack_396 = auVar17._2_2_;
  sStack_394 = auVar17._4_2_;
  sStack_392 = auVar17._6_2_;
  sStack_390 = auVar17._8_2_;
  sStack_38e = auVar17._10_2_;
  sStack_38c = auVar17._12_2_;
  sStack_38a = auVar17._14_2_;
  auVar17._8_8_ = 0x1000100010001;
  auVar17._0_8_ = 0x1000100010001;
  auVar17 = paddusw(*in_R9,auVar17);
  local_408 = auVar17._0_8_;
  uStack_400 = auVar17._8_8_;
  local_408 = (CONCAT26(-(ushort)(sStack_392 == 0),
                        CONCAT24(-(ushort)(sStack_394 == 0),
                                 CONCAT22(-(ushort)(sStack_396 == 0),-(ushort)(local_398 == 0)))) ^
              0xffffffffffffffff) & local_408;
  uStack_400 = (CONCAT26(-(ushort)(sStack_38a == 0),
                         CONCAT24(-(ushort)(sStack_38c == 0),
                                  CONCAT22(-(ushort)(sStack_38e == 0),-(ushort)(sStack_390 == 0))))
               ^ 0xffffffffffffffff) & uStack_400;
  auVar21 = psubusw(*in_RDI,in_RDI[1]);
  auVar17 = psubusw(in_RDI[1],*in_RDI);
  local_2d8 = auVar21._0_8_;
  uStack_2d0 = auVar21._8_8_;
  local_2e8 = auVar17._0_8_;
  uStack_2e0 = auVar17._8_8_;
  *in_R8 = local_2d8 | local_2e8;
  in_R8[1] = uStack_2d0 | uStack_2e0;
  uVar8 = in_R8[1];
  uVar9 = *in_R8;
  uVar10 = in_R8[1];
  max01[1]._0_2_ = (short)uVar9;
  max01[1]._2_2_ = (short)(uVar9 >> 0x10);
  max01[1]._4_2_ = (short)(uVar9 >> 0x20);
  max01[1]._6_2_ = (short)(uVar9 >> 0x30);
  max[0]._0_2_ = (short)uVar10;
  max[0]._2_2_ = (short)(uVar10 >> 0x10);
  max[0]._4_2_ = (short)(uVar10 >> 0x20);
  max[0]._6_2_ = (short)(uVar10 >> 0x30);
  h[1]._0_2_ = (short)uVar8;
  h[1]._2_2_ = (short)(uVar8 >> 0x10);
  h[1]._4_2_ = (short)(uVar8 >> 0x20);
  h[1]._6_2_ = (short)(uVar8 >> 0x30);
  uVar16 = (ushort)((short)max01[1] < (short)h[1]) * (short)h[1] |
           (ushort)((short)max01[1] >= (short)h[1]) * (short)max01[1];
  uVar18 = (ushort)(max01[1]._2_2_ < h[1]._2_2_) * h[1]._2_2_ |
           (ushort)(max01[1]._2_2_ >= h[1]._2_2_) * max01[1]._2_2_;
  uVar19 = (ushort)(max01[1]._4_2_ < h[1]._4_2_) * h[1]._4_2_ |
           (ushort)(max01[1]._4_2_ >= h[1]._4_2_) * max01[1]._4_2_;
  uVar20 = (ushort)(max01[1]._6_2_ < h[1]._6_2_) * h[1]._6_2_ |
           (ushort)(max01[1]._6_2_ >= h[1]._6_2_) * max01[1]._6_2_;
  sVar1 = (ushort)(-1 < (short)max[0]) * (short)max[0];
  sVar2 = (ushort)(-1 < max[0]._2_2_) * max[0]._2_2_;
  sVar3 = (ushort)(-1 < max[0]._4_2_) * max[0]._4_2_;
  sVar4 = (ushort)(-1 < (long)uVar10) * max[0]._6_2_;
  auVar15._2_2_ = uVar18;
  auVar15._0_2_ = uVar16;
  auVar15._4_2_ = uVar19;
  auVar15._6_2_ = uVar20;
  auVar15._10_2_ = sVar2;
  auVar15._8_2_ = sVar1;
  auVar15._12_2_ = sVar3;
  auVar15._14_2_ = sVar4;
  auVar17 = psubusw(auVar15,*(undefined1 (*) [16])one[0]);
  local_3b8 = auVar17._0_2_;
  sStack_3b6 = auVar17._2_2_;
  sStack_3b4 = auVar17._4_2_;
  sStack_3b2 = auVar17._6_2_;
  sStack_3b0 = auVar17._8_2_;
  sStack_3ae = auVar17._10_2_;
  sStack_3ac = auVar17._12_2_;
  sStack_3aa = auVar17._14_2_;
  *(ulong *)one[1] =
       CONCAT26(-(ushort)(sStack_3b2 == 0),
                CONCAT24(-(ushort)(sStack_3b4 == 0),
                         CONCAT22(-(ushort)(sStack_3b6 == 0),-(ushort)(local_3b8 == 0)))) ^
       0xffffffffffffffff;
  *(ulong *)(one[1] + 8) =
       CONCAT26(-(ushort)(sStack_3aa == 0),
                CONCAT24(-(ushort)(sStack_3ac == 0),
                         CONCAT22(-(ushort)(sStack_3ae == 0),-(ushort)(sStack_3b0 == 0)))) ^
       0xffffffffffffffff;
  uVar7 = *(undefined8 *)one[1];
  *(undefined8 *)one[1] = uVar7;
  *(undefined8 *)(one[1] + 8) = uVar7;
  sStack_78 = (short)local_408;
  sStack_76 = (short)(local_408 >> 0x10);
  i._0_2_ = (short)(local_408 >> 0x20);
  i._2_2_ = (short)(local_408 >> 0x30);
  h[0]._0_2_ = (short)uStack_400;
  h[0]._2_2_ = (short)(uStack_400 >> 0x10);
  h[0]._4_2_ = (short)(uStack_400 >> 0x20);
  h[0]._6_2_ = (short)(uStack_400 >> 0x30);
  local_528._2_2_ =
       (sStack_76 < (short)uVar18) * uVar18 | (ushort)(sStack_76 >= (short)uVar18) * sStack_76;
  local_528._0_2_ =
       (sStack_78 < (short)uVar16) * uVar16 | (ushort)(sStack_78 >= (short)uVar16) * sStack_78;
  local_528._4_2_ =
       ((short)i < (short)uVar19) * uVar19 | (ushort)((short)i >= (short)uVar19) * (short)i;
  local_528._6_2_ =
       (i._2_2_ < (short)uVar20) * uVar20 | (ushort)(i._2_2_ >= (short)uVar20) * i._2_2_;
  uStack_520._0_2_ =
       (ushort)((short)h[0] < sVar1) * sVar1 | (ushort)((short)h[0] >= sVar1) * (short)h[0];
  uStack_520._2_2_ =
       (ushort)(h[0]._2_2_ < sVar2) * sVar2 | (ushort)(h[0]._2_2_ >= sVar2) * h[0]._2_2_;
  uStack_520._4_2_ =
       (ushort)(h[0]._4_2_ < sVar3) * sVar3 | (ushort)(h[0]._4_2_ >= sVar3) * h[0]._4_2_;
  uStack_520._6_2_ =
       (ushort)(h[0]._6_2_ < sVar4) * sVar4 | (ushort)(h[0]._6_2_ >= sVar4) * h[0]._6_2_;
  for (local_54c = 2; local_98 = (short)local_528, sStack_96 = local_528._2_2_,
      sStack_94 = local_528._4_2_, sStack_92 = local_528._6_2_, sStack_90 = local_528._8_2_,
      sStack_8e = local_528._10_2_, sStack_8c = local_528._12_2_, sStack_8a = local_528._14_2_,
      local_54c < in_ESI; local_54c = local_54c + 1) {
    auVar21 = psubusw(in_RDI[local_54c],in_RDI[local_54c + -1]);
    auVar17 = psubusw(in_RDI[local_54c + -1],in_RDI[local_54c]);
    local_318 = auVar21._0_8_;
    uStack_310 = auVar21._8_8_;
    local_328 = auVar17._0_8_;
    uStack_320 = auVar17._8_8_;
    local_318 = local_318 | local_328;
    uStack_310 = uStack_310 | uStack_320;
    local_a8 = (short)local_318;
    sStack_a6 = (short)(local_318 >> 0x10);
    sStack_a4 = (short)(local_318 >> 0x20);
    sStack_a2 = (short)(local_318 >> 0x30);
    sStack_a0 = (short)uStack_310;
    sStack_9e = (short)(uStack_310 >> 0x10);
    sStack_9c = (short)(uStack_310 >> 0x20);
    sStack_9a = (short)(uStack_310 >> 0x30);
    local_528._2_2_ =
         (ushort)(sStack_96 < sStack_a6) * sStack_a6 | (ushort)(sStack_96 >= sStack_a6) * sStack_96;
    local_528._0_2_ =
         (ushort)(local_98 < local_a8) * local_a8 | (ushort)(local_98 >= local_a8) * local_98;
    local_528._4_2_ =
         (ushort)(sStack_94 < sStack_a4) * sStack_a4 | (ushort)(sStack_94 >= sStack_a4) * sStack_94;
    local_528._6_2_ =
         (ushort)(sStack_92 < sStack_a2) * sStack_a2 | (ushort)(sStack_92 >= sStack_a2) * sStack_92;
    uStack_520._0_2_ =
         (ushort)(sStack_90 < sStack_a0) * sStack_a0 | (ushort)(sStack_90 >= sStack_a0) * sStack_90;
    uStack_520._2_2_ =
         (ushort)(sStack_8e < sStack_9e) * sStack_9e | (ushort)(sStack_8e >= sStack_9e) * sStack_8e;
    uStack_520._4_2_ =
         (ushort)(sStack_8c < sStack_9c) * sStack_9c | (ushort)(sStack_8c >= sStack_9c) * sStack_8c;
    uStack_520._6_2_ =
         (ushort)(sStack_8a < sStack_9a) * sStack_9a | (ushort)(sStack_8a >= sStack_9a) * sStack_8a;
  }
  local_528._0_4_ =
       CONCAT22((ushort)(sStack_96 < sStack_8e) * sStack_8e |
                (ushort)(sStack_96 >= sStack_8e) * sStack_96,
                (ushort)(local_98 < sStack_90) * sStack_90 |
                (ushort)(local_98 >= sStack_90) * local_98);
  local_528._0_6_ =
       CONCAT24((ushort)(sStack_94 < sStack_8c) * sStack_8c |
                (ushort)(sStack_94 >= sStack_8c) * sStack_94,(undefined4)local_528);
  local_528 = CONCAT26((ushort)(sStack_92 < sStack_8a) * sStack_8a |
                       (ushort)(sStack_92 >= sStack_8a) * sStack_92,(undefined6)local_528);
  uStack_520._0_2_ = (ushort)(-1 < sStack_90) * sStack_90;
  uStack_520._2_2_ = (ushort)(-1 < sStack_8e) * sStack_8e;
  uStack_520._4_2_ = (ushort)(-1 < sStack_8c) * sStack_8c;
  uStack_520._6_2_ = (ushort)(-1 < sStack_8a) * sStack_8a;
  auVar14._8_8_ = uStack_520;
  auVar14._0_8_ = local_528;
  auVar17 = psubusw(auVar14,*in_R9);
  local_3d8 = auVar17._0_2_;
  sStack_3d6 = auVar17._2_2_;
  sStack_3d4 = auVar17._4_2_;
  sStack_3d2 = auVar17._6_2_;
  sStack_3d0 = auVar17._8_2_;
  sStack_3ce = auVar17._10_2_;
  sStack_3cc = auVar17._12_2_;
  sStack_3ca = auVar17._14_2_;
  *(ushort *)zero[0] = -(ushort)(local_3d8 == 0);
  *(ushort *)(zero[0] + 2) = -(ushort)(sStack_3d6 == 0);
  *(ushort *)(zero[0] + 4) = -(ushort)(sStack_3d4 == 0);
  *(ushort *)(zero[0] + 6) = -(ushort)(sStack_3d2 == 0);
  *(ushort *)(zero[0] + 8) = -(ushort)(sStack_3d0 == 0);
  *(ushort *)(zero[0] + 10) = -(ushort)(sStack_3ce == 0);
  *(ushort *)(zero[0] + 0xc) = -(ushort)(sStack_3cc == 0);
  *(ushort *)(zero[0] + 0xe) = -(ushort)(sStack_3ca == 0);
  return;
}

Assistant:

static inline void highbd_hev_filter_mask_x_sse2(__m128i *pq, int x,
                                                 __m128i *p1p0, __m128i *q1q0,
                                                 __m128i *abs_p1p0, __m128i *l,
                                                 __m128i *bl, __m128i *t,
                                                 __m128i *hev, __m128i *mask) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i ffff = _mm_set1_epi16((short)0xFFFF);
  __m128i abs_p0q0_p1q1, abs_p0q0, abs_p1q1, abs_q1q0;
  __m128i max, max01, h;

  *p1p0 = _mm_unpacklo_epi64(pq[0], pq[1]);
  *q1q0 = _mm_unpackhi_epi64(pq[0], pq[1]);

  abs_p0q0_p1q1 = abs_diff16(*p1p0, *q1q0);
  abs_p0q0 = _mm_adds_epu16(abs_p0q0_p1q1, abs_p0q0_p1q1);
  abs_p0q0 = _mm_unpacklo_epi64(abs_p0q0, zero);

  abs_p1q1 = _mm_srli_si128(abs_p0q0_p1q1, 8);
  abs_p1q1 = _mm_srli_epi16(abs_p1q1, 1);  // divide by 2

  max = _mm_subs_epu16(_mm_adds_epu16(abs_p0q0, abs_p1q1), *bl);
  max = _mm_xor_si128(_mm_cmpeq_epi16(max, zero), ffff);
  // mask |= (abs(*p0 - *q0) * 2 + abs(*p1 - *q1) / 2  > blimit) * -1;
  // So taking maximums continues to work:
  max = _mm_and_si128(max, _mm_adds_epu16(*l, one));

  *abs_p1p0 = abs_diff16(pq[0], pq[1]);
  abs_q1q0 = _mm_srli_si128(*abs_p1p0, 8);
  max01 = _mm_max_epi16(*abs_p1p0, abs_q1q0);
  // mask |= (abs(*p1 - *p0) > limit) * -1;
  // mask |= (abs(*q1 - *q0) > limit) * -1;
  h = _mm_subs_epu16(max01, *t);

  *hev = _mm_xor_si128(_mm_cmpeq_epi16(h, zero), ffff);
  // replicate for the further "merged variables" usage
  *hev = _mm_unpacklo_epi64(*hev, *hev);

  max = _mm_max_epi16(max, max01);
  int i;
  for (i = 2; i < x; ++i) {
    max = _mm_max_epi16(max, abs_diff16(pq[i], pq[i - 1]));
  }
  max = _mm_max_epi16(max, _mm_srli_si128(max, 8));

  max = _mm_subs_epu16(max, *l);
  *mask = _mm_cmpeq_epi16(max, zero);  //  ~mask
}